

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFBoundingBox.cpp
# Opt level: O0

bool ZXing::Pdf417::BoundingBox::Merge
               (Nullable<ZXing::Pdf417::BoundingBox> *leftBox,
               Nullable<ZXing::Pdf417::BoundingBox> *rightBox,
               Nullable<ZXing::Pdf417::BoundingBox> *result)

{
  bool bVar1;
  int imgWidth;
  BoundingBox *pBVar2;
  void *in_RDX;
  Nullable<ZXing::Pdf417::BoundingBox> *in_RSI;
  Nullable<ZXing::Pdf417::BoundingBox> *in_RDI;
  BoundingBox box;
  Nullable<ZXing::Pdf417::BoundingBox> *in_stack_ffffffffffffff40;
  int iVar3;
  int iVar4;
  Nullable<ZXing::ResultPoint> *topLeft;
  int imgHeight;
  BoundingBox *in_stack_ffffffffffffff70;
  bool local_1;
  
  bVar1 = ZXing::operator==(in_RDI,(nullptr_t)0x0);
  if (bVar1) {
    memcpy(in_RDX,in_RSI,0x80);
    local_1 = true;
  }
  else {
    bVar1 = ZXing::operator==(in_RSI,(nullptr_t)0x0);
    if (bVar1) {
      memcpy(in_RDX,in_RDI,0x80);
      local_1 = true;
    }
    else {
      BoundingBox((BoundingBox *)in_stack_ffffffffffffff40);
      pBVar2 = Nullable<ZXing::Pdf417::BoundingBox>::value(in_RDI);
      iVar3 = pBVar2->_imgWidth;
      pBVar2 = Nullable<ZXing::Pdf417::BoundingBox>::value(in_RDI);
      iVar4 = pBVar2->_imgHeight;
      pBVar2 = Nullable<ZXing::Pdf417::BoundingBox>::value(in_RDI);
      topLeft = &pBVar2->_topLeft;
      pBVar2 = Nullable<ZXing::Pdf417::BoundingBox>::value(in_RDI);
      imgHeight = (int)((ulong)&pBVar2->_bottomLeft >> 0x20);
      pBVar2 = Nullable<ZXing::Pdf417::BoundingBox>::value(in_RSI);
      imgWidth = (int)pBVar2 + 0x38;
      Nullable<ZXing::Pdf417::BoundingBox>::value(in_RSI);
      pBVar2 = (BoundingBox *)&stack0xffffffffffffff68;
      bVar1 = Create(imgWidth,imgHeight,topLeft,
                     (Nullable<ZXing::ResultPoint> *)CONCAT44(iVar4,iVar3),
                     (Nullable<ZXing::ResultPoint> *)in_stack_ffffffffffffff40,
                     (Nullable<ZXing::ResultPoint> *)pBVar2,in_stack_ffffffffffffff70);
      if (bVar1) {
        Nullable<ZXing::Pdf417::BoundingBox>::operator=(in_stack_ffffffffffffff40,pBVar2);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool
BoundingBox::Merge(const Nullable<BoundingBox>& leftBox, const Nullable<BoundingBox>& rightBox, Nullable<BoundingBox>& result)
{
	if (leftBox == nullptr) {
		result = rightBox;
		return true;
	}
	if (rightBox == nullptr) {
		result = leftBox;
		return true;
	}
	BoundingBox box;
	if (Create(leftBox.value()._imgWidth, leftBox.value()._imgHeight, leftBox.value()._topLeft, leftBox.value()._bottomLeft, rightBox.value()._topRight, rightBox.value()._bottomRight, box)) {
		result = box;
		return true;
	}
	return false;
}